

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GridAxisIrregular::Encode(GridAxisIrregular *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *this_00;
  reference puVar2;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  GridAxisIrregular *this_local;
  
  GridAxisRegular::Encode(&this->super_GridAxisRegular,stream);
  this_00 = KDataStream::operator<<(stream,(double)this->m_f64CoordScaleXi);
  KDataStream::operator<<(this_00,(double)this->m_f64CoordOffsetXi);
  citrEnd = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(&this->m_vXiValues);
  local_28._M_current =
       (unsigned_short *)
       std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(&this->m_vXiValues);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&citrEnd);
    KDataStream::operator<<(stream,*puVar2);
    __gnu_cxx::
    __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&citrEnd);
  }
  citrEnd = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                      (&this->m_vui16Padding);
  local_28._M_current =
       (unsigned_short *)
       std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(&this->m_vui16Padding);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&citrEnd);
    KDataStream::operator<<(stream,*puVar2);
    __gnu_cxx::
    __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void GridAxisIrregular::Encode( KDataStream & stream ) const
{
    GridAxisRegular::Encode( stream );

    stream << m_f64CoordScaleXi
           << m_f64CoordOffsetXi;

    vector<KUINT16>::const_iterator citr = m_vXiValues.begin();
    vector<KUINT16>::const_iterator citrEnd = m_vXiValues.end();

    for( ; citr != citrEnd; ++citr )
    {
        stream << *citr;
    }

    // Padding
    citr = m_vui16Padding.begin();
    citrEnd = m_vui16Padding.end();

    for( ; citr != citrEnd; ++citr )
    {
        stream << *citr;
    }
}